

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

ProgramParams deqp::gles31::Functional::anon_unknown_0::genProgramParams(Random *rnd)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  ProgramParams PVar4;
  
  PVar4.vtxSeed = deRandom_getUint32(&rnd->m_rnd);
  dVar1 = deRandom_getUint32(&rnd->m_rnd);
  dVar2 = deRandom_getUint32(&rnd->m_rnd);
  dVar3 = deRandom_getUint32(&rnd->m_rnd);
  PVar4.vtxScale = (float)(dVar1 % 9 + 8) * 0.0625;
  PVar4.frgScale = (float)(dVar3 % 0x11) * 0.0625;
  PVar4.frgSeed = dVar2;
  return PVar4;
}

Assistant:

ProgramParams genProgramParams (Random& rnd)
{
	const deUint32	vtxSeed		= rnd.getUint32();
	const GLfloat	vtxScale	= (float)rnd.getInt(8, 16) / 16.0f;
	const deUint32	frgSeed		= rnd.getUint32();
	const GLfloat	frgScale	= (float)rnd.getInt(0, 16) / 16.0f;

	return ProgramParams(vtxSeed, vtxScale, frgSeed, frgScale);
}